

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fra.h
# Opt level: O2

int Sml_NodeCheckImp(Fra_Sml_t *p,int Left,int Right)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = p->nWordsTotal;
  lVar4 = (long)p->nWordsPref;
  do {
    if (iVar3 <= lVar4) {
      return 1;
    }
    lVar1 = lVar4 * 4;
    lVar2 = lVar4 * 4;
    lVar4 = lVar4 + 1;
  } while ((*(uint *)((long)&p[1].pAig + lVar2 + (long)(Left * iVar3) * 4) &
           ~*(uint *)((long)&p[1].pAig + lVar1 + (long)(Right * iVar3) * 4)) == 0);
  return 0;
}

Assistant:

static inline unsigned *   Fra_ObjSim( Fra_Sml_t * p, int Id )                           { return p->pData + p->nWordsTotal * Id; }